

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall cppcms::impl::tcp_cache_service::session::save(session *this)

{
  iterator __beg;
  iterator __end;
  element_type *peVar1;
  allocator<char> *in_RDI;
  allocator<char> *this_00;
  allocator<char> *this_01;
  string value;
  string sid;
  time_t timeout;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  difference_type in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffff68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffff70;
  string local_80 [55];
  allocator<char> local_49;
  char *local_48;
  char *local_40;
  char *local_38;
  string local_30 [32];
  time_t local_10;
  
  if (*(uint *)(in_RDI + 0x74) < 0x20) {
    *(undefined4 *)(in_RDI + 0x48) = 5;
  }
  else {
    local_10 = to_time_t(*(int64_t *)(in_RDI + 0x80));
    this_00 = in_RDI + 0x10;
    local_38 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff38);
    local_48 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff38);
    local_40 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                  *)this_00,in_stack_ffffffffffffff40);
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI)
    ;
    std::allocator<char>::~allocator(&local_49);
    this_01 = in_RDI + 0x10;
    __beg = std::vector<char,_std::allocator<char>_>::begin
                      ((vector<char,_std::allocator<char>_> *)this_01);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
              ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)this_00,
               in_stack_ffffffffffffff40);
    __end = std::vector<char,_std::allocator<char>_>::end
                      ((vector<char,_std::allocator<char>_> *)this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              (in_stack_ffffffffffffff60,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               __beg._M_current,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               __end._M_current,in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    peVar1 = std::
             __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x48665e);
    (**peVar1->_vptr_session_storage)(peVar1,local_30,local_10,local_80);
    *(undefined4 *)(in_RDI + 0x48) = 6;
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void save()
	{
		if(hin_.size < 32)
		{
			hout_.opcode=opcodes::error;
			return;
		}
		time_t timeout=to_time_t(hin_.operations.session_save.timeout);
		std::string sid(data_in_.begin(),data_in_.begin()+32);
		std::string value(data_in_.begin()+32,data_in_.end());
		sessions_->save(sid,timeout,value);
		hout_.opcode=opcodes::done;
	}